

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.c
# Opt level: O0

int enet_socket_get_option(ENetSocket socket,ENetSocketOption option,int *value)

{
  int iVar1;
  void *in_RDX;
  int in_ESI;
  int in_EDI;
  socklen_t len;
  int result;
  socklen_t local_18;
  int local_14;
  
  local_14 = -1;
  if (in_ESI == 8) {
    local_18 = 4;
    local_14 = getsockopt(in_EDI,1,4,in_RDX,&local_18);
  }
  else if (in_ESI == 10) {
    local_18 = 4;
    local_14 = getsockopt(in_EDI,0,2,in_RDX,&local_18);
  }
  iVar1 = 0;
  if (local_14 == -1) {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int
enet_socket_get_option (ENetSocket socket, ENetSocketOption option, int * value)
{
    int result = -1;
    socklen_t len;
    switch (option)
    {
        case ENET_SOCKOPT_ERROR:
            len = sizeof (int);
            result = getsockopt (socket, SOL_SOCKET, SO_ERROR, value, & len);
            break;

        case ENET_SOCKOPT_TTL:
            len = sizeof (int);
            result = getsockopt (socket, IPPROTO_IP, IP_TTL, (char *) value, & len);
            break;

        default:
            break;
    }
    return result == -1 ? -1 : 0;
}